

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O0

void __thiscall
CheckedMutexTest_InvalidUnlock0_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedMutexTest_InvalidUnlock0_Test<yamc::checked::timed_mutex> *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_e8;
  Message local_e0 [2];
  system_error *anon_var_0;
  type e;
  byte local_91;
  undefined1 local_90 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  TypeParam mtx;
  CheckedMutexTest_InvalidUnlock0_Test<yamc::checked::timed_mutex> *this_local;
  
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)(gtest_msg.value.field_2._M_local_buf + 8))
  ;
  memset(local_90,0,0x20);
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)local_90);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)local_90);
  if (bVar1) {
    local_91 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      yamc::checked::detail::mutex_base::unlock((mutex_base *)((long)&gtest_msg.value.field_2 + 8));
    }
    if ((local_91 & 1) != 0) goto LAB_001e0f2b;
    std::__cxx11::string::operator=
              ((string *)local_90,
               "Expected: mtx.unlock() throws an exception of type std::system_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_e0);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_e8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
             ,0x60,message);
  testing::internal::AssertHelper::operator=(&local_e8,local_e0);
  testing::internal::AssertHelper::~AssertHelper(&local_e8);
  testing::Message::~Message(local_e0);
LAB_001e0f2b:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)local_90);
  yamc::checked::timed_mutex::~timed_mutex
            ((timed_mutex *)(gtest_msg.value.field_2._M_local_buf + 8));
  return;
}

Assistant:

TYPED_TEST(CheckedMutexTest, InvalidUnlock0) {
  TypeParam mtx;
  EXPECT_CHECK_FAILURE(mtx.unlock());
}